

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfdcapi_transaction.cpp
# Opt level: O0

void __thiscall
cfdcapi_transaction_GetTransaction_Test::TestBody(cfdcapi_transaction_GetTransaction_Test *this)

{
  undefined1 uVar1;
  bool bVar2;
  char *pcVar3;
  char *pcVar4;
  char *in_R9;
  uint32_t *in_stack_00000290;
  char *in_stack_00000298;
  char *in_stack_000002a0;
  char *in_stack_000002a8;
  int in_stack_000002b4;
  void *in_stack_000002b8;
  AssertionResult gtest_ar_33;
  AssertionResult gtest_ar_32;
  AssertionResult gtest_ar_31;
  char *str_buffer;
  AssertionResult gtest_ar_30;
  AssertionResult gtest_ar_29;
  AssertionResult gtest_ar_28;
  AssertionResult gtest_ar_27;
  AssertionResult gtest_ar_26;
  AssertionResult gtest_ar_25;
  uint32_t index;
  AssertionResult gtest_ar_24;
  AssertionResult gtest_ar_23;
  AssertionResult gtest_ar_22;
  AssertionResult gtest_ar_21;
  AssertionResult gtest_ar_20;
  AssertionResult gtest_ar_19;
  uint32_t count;
  AssertionResult gtest_ar_18;
  AssertionResult gtest_ar_17;
  AssertionResult gtest_ar_16;
  char *locking_script;
  int64_t value_satoshi;
  AssertionResult gtest_ar_15;
  AssertionResult gtest_ar_14;
  char *stack_data;
  AssertionResult gtest_ar_13;
  AssertionResult gtest_ar_12;
  AssertionResult gtest_ar_11;
  AssertionResult gtest_ar_10;
  AssertionResult gtest_ar_9;
  uint32_t sequence;
  uint32_t vout;
  char *script_sig;
  char *txin_txid;
  AssertionResult gtest_ar_8;
  AssertionResult gtest_ar_7;
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  uint32_t locktime;
  uint32_t version;
  uint32_t weight;
  uint32_t vsize;
  uint32_t size;
  char *wtxid;
  char *txid;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  int ret;
  void *handle;
  bool *in_stack_fffffffffffff6a8;
  CfdErrorCode *pCVar5;
  undefined4 *puVar6;
  AssertionResult *in_stack_fffffffffffff6b0;
  CfdErrorCode *rhs;
  char **rhs_00;
  CfdErrorCode *in_stack_fffffffffffff6b8;
  CfdErrorCode *lhs;
  char *in_stack_fffffffffffff6c0;
  void **in_stack_fffffffffffff6c8;
  void *in_stack_fffffffffffff6e8;
  AssertionResult *pAVar7;
  char **in_stack_fffffffffffff740;
  uint32_t *in_stack_fffffffffffff920;
  AssertionResult *in_stack_fffffffffffff928;
  undefined4 in_stack_fffffffffffff930;
  int in_stack_fffffffffffff934;
  char **in_stack_fffffffffffff938;
  char **in_stack_fffffffffffff940;
  undefined7 in_stack_fffffffffffff948;
  undefined1 in_stack_fffffffffffff94f;
  undefined8 in_stack_fffffffffffff950;
  int net_type;
  void *in_stack_fffffffffffff958;
  uint32_t *in_stack_fffffffffffff970;
  undefined7 in_stack_fffffffffffff978;
  undefined1 in_stack_fffffffffffff97f;
  uint32_t *in_stack_fffffffffffff980;
  uint32_t *in_stack_fffffffffffff988;
  uint32_t *in_stack_fffffffffffff9f0;
  uint32_t vout_00;
  undefined7 in_stack_fffffffffffffa00;
  AssertHelper in_stack_fffffffffffffa08;
  int in_stack_fffffffffffffa14;
  undefined4 in_stack_fffffffffffffa18;
  undefined4 in_stack_fffffffffffffa1c;
  AssertionResult local_5e0;
  AssertHelper local_5d0;
  Message local_5c8;
  AssertionResult local_5c0;
  AssertHelper local_5b0;
  Message local_5a8;
  undefined4 local_59c;
  AssertionResult local_598;
  char *local_588;
  AssertHelper local_580;
  Message local_578;
  undefined4 local_56c;
  AssertionResult local_568;
  AssertHelper local_558;
  Message local_550;
  undefined4 local_544;
  AssertionResult local_540;
  AssertHelper local_530;
  Message local_528;
  undefined4 local_51c;
  AssertionResult local_518;
  AssertHelper local_508;
  Message local_500;
  undefined4 in_stack_fffffffffffffb08;
  undefined4 in_stack_fffffffffffffb0c;
  uint32_t in_stack_fffffffffffffb14;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffb18;
  int in_stack_fffffffffffffb24;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffb28;
  AssertionResult local_4c8;
  AssertHelper local_4b8;
  Message local_4b0;
  undefined4 local_4a4;
  AssertionResult local_4a0;
  undefined4 local_48c;
  AssertHelper local_488;
  Message local_480;
  undefined4 local_474;
  AssertionResult local_470;
  AssertHelper in_stack_fffffffffffffba0;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffba8;
  uint32_t in_stack_fffffffffffffbb4;
  char *in_stack_fffffffffffffbb8;
  int in_stack_fffffffffffffbc4;
  AssertHelper in_stack_fffffffffffffbc8;
  Message local_430;
  undefined4 local_424;
  AssertionResult local_420;
  AssertHelper local_410;
  Message local_408;
  undefined4 local_3fc;
  AssertionResult local_3f8;
  AssertHelper local_3e8;
  Message local_3e0;
  undefined4 local_3d4;
  AssertionResult local_3d0;
  AssertHelper local_3c0;
  Message local_3b8;
  undefined4 local_3ac;
  char **in_stack_fffffffffffffc58;
  uint32_t in_stack_fffffffffffffc60;
  uint32_t in_stack_fffffffffffffc64;
  undefined4 in_stack_fffffffffffffc68;
  undefined4 in_stack_fffffffffffffc6c;
  int in_stack_fffffffffffffc74;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffc78;
  uint32_t *in_stack_fffffffffffffc80;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffc88;
  uint32_t in_stack_fffffffffffffc94;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffc98;
  int in_stack_fffffffffffffca4;
  void *in_stack_fffffffffffffca8;
  AssertHelper local_348;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffcc0;
  undefined4 in_stack_fffffffffffffcc8;
  undefined4 in_stack_fffffffffffffccc;
  AssertionResult local_330;
  char *local_320;
  undefined8 local_318;
  AssertHelper local_310;
  Message local_308;
  AssertionResult local_300;
  AssertHelper local_2f0;
  Message local_2e8;
  undefined4 local_2dc;
  AssertionResult local_2d8;
  char *local_2c8;
  AssertHelper local_2c0;
  Message local_2b8;
  AssertionResult local_2b0;
  AssertHelper local_2a0;
  Message local_298;
  undefined8 local_290;
  AssertionResult local_288;
  AssertHelper local_278;
  Message local_270;
  undefined4 local_264;
  AssertionResult local_260;
  AssertHelper local_250;
  Message local_248;
  AssertionResult local_240;
  AssertHelper local_230;
  Message local_228;
  undefined4 local_21c;
  AssertionResult local_218;
  undefined4 local_208;
  undefined4 local_204;
  char *local_200;
  char *local_1f8;
  AssertHelper local_1f0;
  Message local_1e8;
  AssertionResult local_1e0;
  AssertHelper local_1d0;
  Message local_1c8;
  AssertionResult local_1c0;
  AssertHelper local_1b0;
  Message local_1a8;
  undefined4 local_19c;
  AssertionResult local_198;
  AssertHelper local_188;
  Message local_180;
  undefined4 local_174;
  AssertionResult local_170;
  AssertHelper local_160;
  Message local_158;
  undefined4 local_14c;
  AssertionResult local_148;
  AssertHelper local_138;
  Message local_130;
  undefined4 local_124;
  AssertionResult local_120;
  AssertHelper local_110;
  Message local_108;
  undefined4 local_fc;
  AssertionResult local_f8;
  AssertHelper local_e8;
  Message local_e0;
  undefined4 local_d4;
  AssertionResult local_d0;
  char local_bc [4];
  CfdErrorCode local_b8 [4];
  char *local_a8;
  char *local_a0;
  string local_98;
  AssertHelper local_78;
  Message local_70;
  undefined1 local_61;
  AssertionResult local_60;
  AssertHelper local_50;
  Message local_48 [3];
  undefined4 local_2c;
  AssertionResult local_28;
  int local_14;
  long local_10;
  
  net_type = (int)((ulong)in_stack_fffffffffffff950 >> 0x20);
  local_10 = 0;
  local_14 = CfdCreateHandle(in_stack_fffffffffffff6c8);
  local_2c = 0;
  pAVar7 = &local_28;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)in_stack_fffffffffffff6c8,in_stack_fffffffffffff6c0,in_stack_fffffffffffff6b8,
             (int *)in_stack_fffffffffffff6b0);
  uVar1 = testing::AssertionResult::operator_cast_to_bool(pAVar7);
  vout_00 = (uint32_t)((ulong)pAVar7 >> 0x20);
  if (!(bool)uVar1) {
    testing::Message::Message(local_48);
    in_stack_fffffffffffff9f0 =
         (uint32_t *)testing::AssertionResult::failure_message((AssertionResult *)0x3bbbfa);
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_transaction.cpp"
               ,0x19a,(char *)in_stack_fffffffffffff9f0);
    testing::internal::AssertHelper::operator=(&local_50,local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    testing::Message::~Message((Message *)0x3bbc5d);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x3bbcb2);
  local_61 = local_10 != 0;
  testing::AssertionResult::AssertionResult<bool>
            (in_stack_fffffffffffff6b0,in_stack_fffffffffffff6a8,(type *)0x3bbce6);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_60);
  if (!bVar2) {
    testing::Message::Message(&local_70);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_98,(internal *)&local_60,(AssertionResult *)"(NULL == handle)","true","false",
               in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_transaction.cpp"
               ,0x19b,pcVar3);
    testing::internal::AssertHelper::operator=(&local_78,&local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    std::__cxx11::string::~string((string *)&local_98);
    testing::Message::~Message((Message *)0x3bbde2);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x3bbe5d);
  local_a0 = (char *)0x0;
  local_a8 = (char *)0x0;
  local_b8[3] = 0;
  local_b8[2] = 0;
  local_b8[1] = 0;
  local_b8[0] = kCfdSuccess;
  local_bc[0] = '\0';
  local_bc[1] = '\0';
  local_bc[2] = '\0';
  local_bc[3] = '\0';
  pcVar3 = local_bc;
  lhs = local_b8;
  rhs = local_b8 + 1;
  pCVar5 = local_b8 + 2;
  local_14 = CfdGetTxInfo(in_stack_fffffffffffff958,net_type,
                          (char *)CONCAT17(in_stack_fffffffffffff94f,in_stack_fffffffffffff948),
                          in_stack_fffffffffffff940,in_stack_fffffffffffff938,
                          (uint32_t *)CONCAT44(in_stack_fffffffffffff934,in_stack_fffffffffffff930),
                          in_stack_fffffffffffff970,
                          (uint32_t *)CONCAT17(in_stack_fffffffffffff97f,in_stack_fffffffffffff978),
                          in_stack_fffffffffffff980,in_stack_fffffffffffff988);
  local_d4 = 0;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)in_stack_fffffffffffff6c8,pcVar3,lhs,rhs);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_d0);
  if (!bVar2) {
    testing::Message::Message(&local_e0);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x3bbfc0);
    testing::internal::AssertHelper::AssertHelper
              (&local_e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_transaction.cpp"
               ,0x1a7,pcVar4);
    testing::internal::AssertHelper::operator=(&local_e8,&local_e0);
    testing::internal::AssertHelper::~AssertHelper(&local_e8);
    testing::Message::~Message((Message *)0x3bc023);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x3bc078);
  local_fc = 800;
  testing::internal::EqHelper<false>::Compare<int,unsigned_int>
            ((char *)in_stack_fffffffffffff6c8,pcVar3,lhs,(uint *)rhs);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_f8);
  if (!bVar2) {
    testing::Message::Message(&local_108);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x3bc125);
    testing::internal::AssertHelper::AssertHelper
              (&local_110,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_transaction.cpp"
               ,0x1a8,pcVar4);
    testing::internal::AssertHelper::operator=(&local_110,&local_108);
    testing::internal::AssertHelper::~AssertHelper(&local_110);
    testing::Message::~Message((Message *)0x3bc188);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x3bc1dd);
  local_124 = 0x13c;
  testing::internal::EqHelper<false>::Compare<int,unsigned_int>
            ((char *)in_stack_fffffffffffff6c8,pcVar3,lhs,(uint *)rhs);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_120);
  if (!bVar2) {
    testing::Message::Message(&local_130);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x3bc28a);
    testing::internal::AssertHelper::AssertHelper
              (&local_138,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_transaction.cpp"
               ,0x1a9,pcVar4);
    testing::internal::AssertHelper::operator=(&local_138,&local_130);
    testing::internal::AssertHelper::~AssertHelper(&local_138);
    testing::Message::~Message((Message *)0x3bc2ed);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x3bc342);
  local_14c = 0x4ee;
  pAVar7 = &local_148;
  testing::internal::EqHelper<false>::Compare<int,unsigned_int>
            ((char *)in_stack_fffffffffffff6c8,pcVar3,lhs,(uint *)rhs);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(pAVar7);
  if (!bVar2) {
    testing::Message::Message(&local_158);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x3bc3ef);
    testing::internal::AssertHelper::AssertHelper
              (&local_160,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_transaction.cpp"
               ,0x1aa,pcVar4);
    testing::internal::AssertHelper::operator=(&local_160,&local_158);
    testing::internal::AssertHelper::~AssertHelper(&local_160);
    testing::Message::~Message((Message *)0x3bc452);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x3bc4a7);
  local_174 = 1;
  pAVar7 = &local_170;
  testing::internal::EqHelper<false>::Compare<int,unsigned_int>
            ((char *)in_stack_fffffffffffff6c8,pcVar3,lhs,(uint *)rhs);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(pAVar7);
  if (!bVar2) {
    testing::Message::Message(&local_180);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x3bc554);
    testing::internal::AssertHelper::AssertHelper
              (&local_188,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_transaction.cpp"
               ,0x1ab,pcVar4);
    testing::internal::AssertHelper::operator=(&local_188,&local_180);
    testing::internal::AssertHelper::~AssertHelper(&local_188);
    testing::Message::~Message((Message *)0x3bc5b7);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x3bc60c);
  local_19c = 0;
  pAVar7 = &local_198;
  testing::internal::EqHelper<true>::Compare<int,unsigned_int>
            ((char *)in_stack_fffffffffffff6c8,pcVar3,lhs,(uint *)rhs,pCVar5);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(pAVar7);
  if (!bVar2) {
    testing::Message::Message(&local_1a8);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x3bc6be);
    testing::internal::AssertHelper::AssertHelper
              (&local_1b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_transaction.cpp"
               ,0x1ac,pcVar4);
    testing::internal::AssertHelper::operator=(&local_1b0,&local_1a8);
    testing::internal::AssertHelper::~AssertHelper(&local_1b0);
    testing::Message::~Message((Message *)0x3bc721);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x3bc776);
  if (local_14 == 0) {
    pAVar7 = &local_1c0;
    testing::internal::CmpHelperSTREQ
              ((internal *)pAVar7,
               "\"27eae69aff1dd4388c0fa05cbbfe9a3983d1b0b5811ebcd4199b86f299370aac\"","txid",
               "27eae69aff1dd4388c0fa05cbbfe9a3983d1b0b5811ebcd4199b86f299370aac",local_a0);
    bVar2 = testing::AssertionResult::operator_cast_to_bool(pAVar7);
    if (!bVar2) {
      testing::Message::Message(&local_1c8);
      in_stack_fffffffffffff938 =
           (char **)testing::AssertionResult::failure_message((AssertionResult *)0x3bc825);
      testing::internal::AssertHelper::AssertHelper
                (&local_1d0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_transaction.cpp"
                 ,0x1ae,(char *)in_stack_fffffffffffff938);
      testing::internal::AssertHelper::operator=(&local_1d0,&local_1c8);
      testing::internal::AssertHelper::~AssertHelper(&local_1d0);
      testing::Message::~Message((Message *)0x3bc888);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3bc8dd);
    in_stack_fffffffffffff928 = &local_1e0;
    testing::internal::CmpHelperSTREQ
              ((internal *)in_stack_fffffffffffff928,
               "\"65dab5dd46a501fc695822c73d779067f2feb7c49dc47d39f86fdb2e3960b3bd\"","wtxid",
               "65dab5dd46a501fc695822c73d779067f2feb7c49dc47d39f86fdb2e3960b3bd",local_a8);
    bVar2 = testing::AssertionResult::operator_cast_to_bool(in_stack_fffffffffffff928);
    in_stack_fffffffffffff934 = CONCAT13(bVar2,(int3)in_stack_fffffffffffff934);
    if (!bVar2) {
      testing::Message::Message(&local_1e8);
      in_stack_fffffffffffff920 =
           (uint32_t *)testing::AssertionResult::failure_message((AssertionResult *)0x3bc97e);
      testing::internal::AssertHelper::AssertHelper
                (&local_1f0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_transaction.cpp"
                 ,0x1af,(char *)in_stack_fffffffffffff920);
      testing::internal::AssertHelper::operator=(&local_1f0,&local_1e8);
      testing::internal::AssertHelper::~AssertHelper(&local_1f0);
      testing::Message::~Message((Message *)0x3bc9e1);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3bca36);
    CfdFreeStringBuffer((char *)lhs);
    CfdFreeStringBuffer((char *)lhs);
  }
  local_1f8 = (char *)0x0;
  local_200 = (char *)0x0;
  local_204 = 0;
  local_208 = 0;
  rhs_00 = &local_200;
  puVar6 = &local_208;
  local_14 = CfdGetTxIn(in_stack_fffffffffffffca8,in_stack_fffffffffffffca4,
                        (char *)in_stack_fffffffffffffc98.ptr_,in_stack_fffffffffffffc94,
                        (char **)in_stack_fffffffffffffc88.ptr_,in_stack_fffffffffffffc80,
                        (uint32_t *)in_stack_fffffffffffffcc0.ptr_,
                        (char **)CONCAT44(in_stack_fffffffffffffccc,in_stack_fffffffffffffcc8));
  local_21c = 0;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)in_stack_fffffffffffff6c8,pcVar3,lhs,(int *)rhs_00);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_218);
  if (!bVar2) {
    testing::Message::Message(&local_228);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x3bcb76);
    testing::internal::AssertHelper::AssertHelper
              (&local_230,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_transaction.cpp"
               ,0x1bb,pcVar4);
    testing::internal::AssertHelper::operator=(&local_230,&local_228);
    testing::internal::AssertHelper::~AssertHelper(&local_230);
    testing::Message::~Message((Message *)0x3bcbd9);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x3bcc2e);
  if (local_14 == 0) {
    testing::internal::CmpHelperSTREQ
              ((internal *)&local_240,
               "\"6eb98797a21c6c10aa74edf29d618be109f48a8e94c694f3701e08ca69186436\"","txin_txid",
               "6eb98797a21c6c10aa74edf29d618be109f48a8e94c694f3701e08ca69186436",local_1f8);
    bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_240);
    if (!bVar2) {
      testing::Message::Message(&local_248);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x3bccdd);
      testing::internal::AssertHelper::AssertHelper
                (&local_250,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_transaction.cpp"
                 ,0x1bd,pcVar4);
      testing::internal::AssertHelper::operator=(&local_250,&local_248);
      testing::internal::AssertHelper::~AssertHelper(&local_250);
      testing::Message::~Message((Message *)0x3bcd40);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3bcd95);
    local_264 = 1;
    testing::internal::EqHelper<false>::Compare<int,unsigned_int>
              ((char *)in_stack_fffffffffffff6c8,pcVar3,lhs,(uint *)rhs_00);
    bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_260);
    if (!bVar2) {
      testing::Message::Message(&local_270);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x3bce42);
      testing::internal::AssertHelper::AssertHelper
                (&local_278,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_transaction.cpp"
                 ,0x1be,pcVar4);
      testing::internal::AssertHelper::operator=(&local_278,&local_270);
      testing::internal::AssertHelper::~AssertHelper(&local_278);
      testing::Message::~Message((Message *)0x3bcea5);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3bcefa);
    local_290 = 0xffffffff;
    testing::internal::EqHelper<false>::Compare<long,unsigned_int>
              ((char *)in_stack_fffffffffffff6c8,pcVar3,(long *)lhs,(uint *)rhs_00);
    bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_288);
    if (!bVar2) {
      testing::Message::Message(&local_298);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x3bcfa9);
      testing::internal::AssertHelper::AssertHelper
                (&local_2a0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_transaction.cpp"
                 ,0x1bf,pcVar4);
      testing::internal::AssertHelper::operator=(&local_2a0,&local_298);
      testing::internal::AssertHelper::~AssertHelper(&local_2a0);
      testing::Message::~Message((Message *)0x3bd00c);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3bd061);
    testing::internal::CmpHelperSTREQ
              ((internal *)&local_2b0,
               "\"220020a16b5755f7f6f96dbd65f5f0d6ab9418b89af4b1f14a1bb8a09062c35f0dcb54\"",
               "script_sig","220020a16b5755f7f6f96dbd65f5f0d6ab9418b89af4b1f14a1bb8a09062c35f0dcb54"
               ,local_200);
    bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_2b0);
    if (!bVar2) {
      testing::Message::Message(&local_2b8);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x3bd102);
      testing::internal::AssertHelper::AssertHelper
                (&local_2c0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_transaction.cpp"
                 ,0x1c0,pcVar4);
      testing::internal::AssertHelper::operator=(&local_2c0,&local_2b8);
      testing::internal::AssertHelper::~AssertHelper(&local_2c0);
      testing::Message::~Message((Message *)0x3bd165);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3bd1ba);
    CfdFreeStringBuffer((char *)lhs);
    CfdFreeStringBuffer((char *)lhs);
  }
  local_2c8 = (char *)0x0;
  local_14 = CfdGetTxInWitness(in_stack_fffffffffffffc78.ptr_,in_stack_fffffffffffffc74,
                               (char *)CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68)
                               ,in_stack_fffffffffffffc64,in_stack_fffffffffffffc60,
                               in_stack_fffffffffffffc58);
  local_2dc = 0;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)in_stack_fffffffffffff6c8,pcVar3,lhs,(int *)rhs_00);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_2d8);
  if (!bVar2) {
    testing::Message::Message(&local_2e8);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x3bd2bc);
    testing::internal::AssertHelper::AssertHelper
              (&local_2f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_transaction.cpp"
               ,0x1c8,pcVar4);
    testing::internal::AssertHelper::operator=(&local_2f0,&local_2e8);
    testing::internal::AssertHelper::~AssertHelper(&local_2f0);
    testing::Message::~Message((Message *)0x3bd31f);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x3bd374);
  if (local_14 == 0) {
    testing::internal::CmpHelperSTREQ
              ((internal *)&local_300,
               "\"56210307b8ae49ac90a048e9b53357a2354b3334e9c8bee813ecb98e99a7e07e8c3ba32103b28f0c28bfab54554ae8c658ac5c3e0ce6e79ad336331f78c428dd43eea8449b21034b8113d703413d57761b8b9781957b8c0ac1dfe69f492580ca4195f50376ba4a21033400f6afecb833092a9a21cfdf1ed1376e58c5d1f47de74683123987e967a8f42103a6d48b1131e94ba04d9737d61acdaa1322008af9602b3b14862c07a1789aac162102d8b661b0b3302ee2f162b09e07a55ad5dfbe673a9f01d9f0c19617681024306b56ae\""
               ,"stack_data",
               "56210307b8ae49ac90a048e9b53357a2354b3334e9c8bee813ecb98e99a7e07e8c3ba32103b28f0c28bfab54554ae8c658ac5c3e0ce6e79ad336331f78c428dd43eea8449b21034b8113d703413d57761b8b9781957b8c0ac1dfe69f492580ca4195f50376ba4a21033400f6afecb833092a9a21cfdf1ed1376e58c5d1f47de74683123987e967a8f42103a6d48b1131e94ba04d9737d61acdaa1322008af9602b3b14862c07a1789aac162102d8b661b0b3302ee2f162b09e07a55ad5dfbe673a9f01d9f0c19617681024306b56ae"
               ,local_2c8);
    bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_300);
    if (!bVar2) {
      testing::Message::Message(&local_308);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x3bd423);
      testing::internal::AssertHelper::AssertHelper
                (&local_310,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_transaction.cpp"
                 ,0x1ca,pcVar4);
      testing::internal::AssertHelper::operator=(&local_310,&local_308);
      testing::internal::AssertHelper::~AssertHelper(&local_310);
      testing::Message::~Message((Message *)0x3bd486);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3bd4db);
    CfdFreeStringBuffer((char *)lhs);
  }
  local_318 = 0;
  local_320 = (char *)0x0;
  local_14 = CfdGetTxOut(in_stack_fffffffffffffbc8.data_,in_stack_fffffffffffffbc4,
                         in_stack_fffffffffffffbb8,in_stack_fffffffffffffbb4,
                         (int64_t *)in_stack_fffffffffffffba8.ptr_,
                         (char **)in_stack_fffffffffffffba0.data_);
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)in_stack_fffffffffffff6c8,pcVar3,lhs,(int *)rhs_00);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_330);
  if (!bVar2) {
    testing::Message::Message((Message *)&stack0xfffffffffffffcc0);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x3bd5e1);
    testing::internal::AssertHelper::AssertHelper
              (&local_348,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_transaction.cpp"
               ,0x1d3,pcVar4);
    testing::internal::AssertHelper::operator=(&local_348,(Message *)&stack0xfffffffffffffcc0);
    testing::internal::AssertHelper::~AssertHelper(&local_348);
    testing::Message::~Message((Message *)0x3bd644);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x3bd69c);
  if (local_14 == 0) {
    testing::internal::EqHelper<false>::Compare<int,long>
              ((char *)in_stack_fffffffffffff6c8,pcVar3,lhs,(long *)rhs_00);
    bVar2 = testing::AssertionResult::operator_cast_to_bool
                      ((AssertionResult *)&stack0xfffffffffffffca8);
    if (!bVar2) {
      testing::Message::Message((Message *)&stack0xfffffffffffffc98);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x3bd757);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&stack0xfffffffffffffc90,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_transaction.cpp"
                 ,0x1d5,pcVar4);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&stack0xfffffffffffffc90,(Message *)&stack0xfffffffffffffc98);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffc90);
      testing::Message::~Message((Message *)0x3bd7ba);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3bd80f);
    testing::internal::CmpHelperSTREQ
              ((internal *)&stack0xfffffffffffffc80,
               "\"76a9147480a33f950689af511e6e84c138dbbd3c3ee41588ac\"","locking_script",
               "76a9147480a33f950689af511e6e84c138dbbd3c3ee41588ac",local_320);
    bVar2 = testing::AssertionResult::operator_cast_to_bool
                      ((AssertionResult *)&stack0xfffffffffffffc80);
    if (!bVar2) {
      testing::Message::Message((Message *)&stack0xfffffffffffffc78);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x3bd8b0);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&stack0xfffffffffffffc70,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_transaction.cpp"
                 ,0x1d6,pcVar4);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&stack0xfffffffffffffc70,(Message *)&stack0xfffffffffffffc78);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffc70);
      testing::Message::~Message((Message *)0x3bd913);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3bd968);
    CfdFreeStringBuffer((char *)lhs);
  }
  local_14 = CfdGetTxInCount(in_stack_fffffffffffff938,in_stack_fffffffffffff934,
                             &in_stack_fffffffffffff928->success_,in_stack_fffffffffffff920);
  local_3ac = 0;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)in_stack_fffffffffffff6c8,pcVar3,lhs,(int *)rhs_00);
  bVar2 = testing::AssertionResult::operator_cast_to_bool
                    ((AssertionResult *)&stack0xfffffffffffffc58);
  if (!bVar2) {
    testing::Message::Message(&local_3b8);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x3bda54);
    testing::internal::AssertHelper::AssertHelper
              (&local_3c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_transaction.cpp"
               ,0x1dd,pcVar4);
    testing::internal::AssertHelper::operator=(&local_3c0,&local_3b8);
    testing::internal::AssertHelper::~AssertHelper(&local_3c0);
    testing::Message::~Message((Message *)0x3bdab7);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x3bdb0c);
  local_3d4 = 1;
  testing::internal::EqHelper<false>::Compare<int,unsigned_int>
            ((char *)in_stack_fffffffffffff6c8,pcVar3,lhs,(uint *)rhs_00);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_3d0);
  if (!bVar2) {
    testing::Message::Message(&local_3e0);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x3bdbb9);
    testing::internal::AssertHelper::AssertHelper
              (&local_3e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_transaction.cpp"
               ,0x1de,pcVar4);
    testing::internal::AssertHelper::operator=(&local_3e8,&local_3e0);
    testing::internal::AssertHelper::~AssertHelper(&local_3e8);
    testing::Message::~Message((Message *)0x3bdc1c);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x3bdc74);
  local_14 = CfdGetTxInWitnessCount
                       (in_stack_fffffffffffffb28.ptr_,in_stack_fffffffffffffb24,
                        (char *)in_stack_fffffffffffffb18.ptr_,in_stack_fffffffffffffb14,
                        (uint32_t *)CONCAT44(in_stack_fffffffffffffb0c,in_stack_fffffffffffffb08));
  local_3fc = 0;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)in_stack_fffffffffffff6c8,pcVar3,lhs,(int *)rhs_00);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_3f8);
  if (!bVar2) {
    testing::Message::Message(&local_408);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x3bdd48);
    testing::internal::AssertHelper::AssertHelper
              (&local_410,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_transaction.cpp"
               ,0x1e2,pcVar4);
    testing::internal::AssertHelper::operator=(&local_410,&local_408);
    testing::internal::AssertHelper::~AssertHelper(&local_410);
    testing::Message::~Message((Message *)0x3bddab);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x3bde00);
  local_424 = 8;
  testing::internal::EqHelper<false>::Compare<int,unsigned_int>
            ((char *)in_stack_fffffffffffff6c8,pcVar3,lhs,(uint *)rhs_00);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_420);
  if (!bVar2) {
    testing::Message::Message(&local_430);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x3bdead);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xfffffffffffffbc8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_transaction.cpp"
               ,0x1e3,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&stack0xfffffffffffffbc8,&local_430);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffbc8);
    testing::Message::~Message((Message *)0x3bdf10);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x3bdf68);
  local_14 = CfdGetTxOutCount(in_stack_fffffffffffff938,in_stack_fffffffffffff934,
                              &in_stack_fffffffffffff928->success_,in_stack_fffffffffffff920);
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)in_stack_fffffffffffff6c8,pcVar3,lhs,(int *)rhs_00);
  bVar2 = testing::AssertionResult::operator_cast_to_bool
                    ((AssertionResult *)&stack0xfffffffffffffbb8);
  if (!bVar2) {
    testing::Message::Message((Message *)&stack0xfffffffffffffba8);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x3be03a);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xfffffffffffffba0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_transaction.cpp"
               ,0x1e7,pcVar4);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xfffffffffffffba0,(Message *)&stack0xfffffffffffffba8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffba0);
    testing::Message::~Message((Message *)0x3be09d);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x3be0f2);
  local_474 = 2;
  testing::internal::EqHelper<false>::Compare<int,unsigned_int>
            ((char *)in_stack_fffffffffffff6c8,pcVar3,lhs,(uint *)rhs_00);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_470);
  if (!bVar2) {
    testing::Message::Message(&local_480);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x3be19f);
    testing::internal::AssertHelper::AssertHelper
              (&local_488,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_transaction.cpp"
               ,0x1e8,pcVar4);
    testing::internal::AssertHelper::operator=(&local_488,&local_480);
    testing::internal::AssertHelper::~AssertHelper(&local_488);
    testing::Message::~Message((Message *)0x3be202);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x3be25a);
  local_48c = 0;
  local_14 = CfdGetTxInIndex((void *)CONCAT44(in_stack_fffffffffffffa1c,in_stack_fffffffffffffa18),
                             in_stack_fffffffffffffa14,(char *)in_stack_fffffffffffffa08.data_,
                             (char *)CONCAT17(uVar1,in_stack_fffffffffffffa00),vout_00,
                             in_stack_fffffffffffff9f0);
  local_4a4 = 0;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)in_stack_fffffffffffff6c8,pcVar3,lhs,(int *)rhs_00);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_4a0);
  if (!bVar2) {
    testing::Message::Message(&local_4b0);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x3be344);
    testing::internal::AssertHelper::AssertHelper
              (&local_4b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_transaction.cpp"
               ,0x1ee,pcVar4);
    testing::internal::AssertHelper::operator=(&local_4b8,&local_4b0);
    testing::internal::AssertHelper::~AssertHelper(&local_4b8);
    testing::Message::~Message((Message *)0x3be3a7);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x3be3fc);
  testing::internal::EqHelper<true>::Compare<int,unsigned_int>
            ((char *)in_stack_fffffffffffff6c8,pcVar3,lhs,(uint *)rhs_00,puVar6);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_4c8);
  if (!bVar2) {
    testing::Message::Message((Message *)&stack0xfffffffffffffb28);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x3be4ae);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xfffffffffffffb20,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_transaction.cpp"
               ,0x1ef,pcVar4);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xfffffffffffffb20,(Message *)&stack0xfffffffffffffb28);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffb20);
    testing::Message::~Message((Message *)0x3be511);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x3be569);
  local_14 = CfdGetTxOutIndex(in_stack_000002b8,in_stack_000002b4,in_stack_000002a8,
                              in_stack_000002a0,in_stack_00000298,in_stack_00000290);
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)in_stack_fffffffffffff6c8,pcVar3,lhs,(int *)rhs_00);
  bVar2 = testing::AssertionResult::operator_cast_to_bool
                    ((AssertionResult *)&stack0xfffffffffffffb10);
  if (!bVar2) {
    testing::Message::Message(&local_500);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x3be649);
    testing::internal::AssertHelper::AssertHelper
              (&local_508,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_transaction.cpp"
               ,499,pcVar4);
    testing::internal::AssertHelper::operator=(&local_508,&local_500);
    testing::internal::AssertHelper::~AssertHelper(&local_508);
    testing::Message::~Message((Message *)0x3be6ac);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x3be701);
  local_51c = 0;
  pAVar7 = &local_518;
  testing::internal::EqHelper<true>::Compare<int,unsigned_int>
            ((char *)in_stack_fffffffffffff6c8,pcVar3,lhs,(uint *)rhs_00,puVar6);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(pAVar7);
  if (!bVar2) {
    testing::Message::Message(&local_528);
    in_stack_fffffffffffff740 =
         (char **)testing::AssertionResult::failure_message((AssertionResult *)0x3be7b3);
    testing::internal::AssertHelper::AssertHelper
              (&local_530,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_transaction.cpp"
               ,500,(char *)in_stack_fffffffffffff740);
    testing::internal::AssertHelper::operator=(&local_530,&local_528);
    testing::internal::AssertHelper::~AssertHelper(&local_530);
    testing::Message::~Message((Message *)0x3be816);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x3be86e);
  local_14 = CfdGetTxOutIndex(in_stack_000002b8,in_stack_000002b4,in_stack_000002a8,
                              in_stack_000002a0,in_stack_00000298,in_stack_00000290);
  local_544 = 0;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)in_stack_fffffffffffff6c8,pcVar3,lhs,(int *)rhs_00);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_540);
  if (!bVar2) {
    testing::Message::Message(&local_550);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x3be94e);
    testing::internal::AssertHelper::AssertHelper
              (&local_558,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_transaction.cpp"
               ,0x1f8,pcVar4);
    testing::internal::AssertHelper::operator=(&local_558,&local_550);
    testing::internal::AssertHelper::~AssertHelper(&local_558);
    testing::Message::~Message((Message *)0x3be9b1);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x3bea06);
  local_56c = 1;
  testing::internal::EqHelper<false>::Compare<int,unsigned_int>
            ((char *)in_stack_fffffffffffff6c8,pcVar3,lhs,(uint *)rhs_00);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_568);
  if (!bVar2) {
    testing::Message::Message(&local_578);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x3beaa7);
    testing::internal::AssertHelper::AssertHelper
              (&local_580,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_transaction.cpp"
               ,0x1f9,pcVar4);
    testing::internal::AssertHelper::operator=(&local_580,&local_578);
    testing::internal::AssertHelper::~AssertHelper(&local_580);
    testing::Message::~Message((Message *)0x3beb04);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x3beb5c);
  local_14 = CfdGetLastErrorCode(in_stack_fffffffffffff6e8);
  if (local_14 != 0) {
    local_588 = (char *)0x0;
    local_14 = CfdGetLastErrorMessage(pAVar7,in_stack_fffffffffffff740);
    local_59c = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)in_stack_fffffffffffff6c8,pcVar3,lhs,(int *)rhs_00);
    bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_598);
    if (!bVar2) {
      testing::Message::Message(&local_5a8);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x3bec47);
      testing::internal::AssertHelper::AssertHelper
                (&local_5b0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_transaction.cpp"
                 ,0x1ff,pcVar4);
      testing::internal::AssertHelper::operator=(&local_5b0,&local_5a8);
      testing::internal::AssertHelper::~AssertHelper(&local_5b0);
      testing::Message::~Message((Message *)0x3beca4);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3becf9);
    pAVar7 = &local_5c0;
    testing::internal::CmpHelperSTREQ((internal *)pAVar7,"\"\"","str_buffer","",local_588);
    bVar2 = testing::AssertionResult::operator_cast_to_bool(pAVar7);
    if (!bVar2) {
      testing::Message::Message(&local_5c8);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)0x3bed8e);
      testing::internal::AssertHelper::AssertHelper
                (&local_5d0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_transaction.cpp"
                 ,0x200,pcVar4);
      testing::internal::AssertHelper::operator=(&local_5d0,&local_5c8);
      testing::internal::AssertHelper::~AssertHelper(&local_5d0);
      testing::Message::~Message((Message *)0x3bedeb);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3bee40);
    CfdFreeStringBuffer((char *)lhs);
    local_588 = (char *)0x0;
  }
  local_14 = CfdFreeHandle(lhs);
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)in_stack_fffffffffffff6c8,pcVar3,lhs,(int *)rhs_00);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_5e0);
  if (!bVar2) {
    testing::Message::Message((Message *)&stack0xfffffffffffffa10);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x3bef10);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xfffffffffffffa08,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_transaction.cpp"
               ,0x206,pcVar3);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xfffffffffffffa08,(Message *)&stack0xfffffffffffffa10);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffa08);
    testing::Message::~Message((Message *)0x3bef6d);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x3befc2);
  return;
}

Assistant:

TEST(cfdcapi_transaction, GetTransaction) {
  static const char* exp_tx = "0100000000010136641869ca081e70f394c6948e8af409e18b619df2ed74aa106c1ca29787b96e0100000023220020a16b5755f7f6f96dbd65f5f0d6ab9418b89af4b1f14a1bb8a09062c35f0dcb54ffffffff0200e9a435000000001976a914389ffce9cd9ae88dcc0631e88a821ffdbe9bfe2688acc0832f05000000001976a9147480a33f950689af511e6e84c138dbbd3c3ee41588ac080047304402206ac44d672dac41f9b00e28f4df20c52eeb087207e8d758d76d92c6fab3b73e2b0220367750dbbe19290069cba53d096f44530e4f98acaa594810388cf7409a1870ce01473044022068c7946a43232757cbdf9176f009a928e1cd9a1a8c212f15c1e11ac9f2925d9002205b75f937ff2f9f3c1246e547e54f62e027f64eefa2695578cc6432cdabce271502473044022059ebf56d98010a932cf8ecfec54c48e6139ed6adb0728c09cbe1e4fa0915302e022007cd986c8fa870ff5d2b3a89139c9fe7e499259875357e20fcbb15571c76795403483045022100fbefd94bd0a488d50b79102b5dad4ab6ced30c4069f1eaa69a4b5a763414067e02203156c6a5c9cf88f91265f5a942e96213afae16d83321c8b31bb342142a14d16381483045022100a5263ea0553ba89221984bd7f0b13613db16e7a70c549a86de0cc0444141a407022005c360ef0ae5a5d4f9f2f87a56c1546cc8268cab08c73501d6b3be2e1e1a8a08824730440220525406a1482936d5a21888260dc165497a90a15669636d8edca6b9fe490d309c022032af0c646a34a44d1f4576bf6a4a74b67940f8faa84c7df9abe12a01a11e2b4783cf56210307b8ae49ac90a048e9b53357a2354b3334e9c8bee813ecb98e99a7e07e8c3ba32103b28f0c28bfab54554ae8c658ac5c3e0ce6e79ad336331f78c428dd43eea8449b21034b8113d703413d57761b8b9781957b8c0ac1dfe69f492580ca4195f50376ba4a21033400f6afecb833092a9a21cfdf1ed1376e58c5d1f47de74683123987e967a8f42103a6d48b1131e94ba04d9737d61acdaa1322008af9602b3b14862c07a1789aac162102d8b661b0b3302ee2f162b09e07a55ad5dfbe673a9f01d9f0c19617681024306b56ae00000000";

  void* handle = NULL;
  int ret = CfdCreateHandle(&handle);
  EXPECT_EQ(kCfdSuccess, ret);
  EXPECT_FALSE((NULL == handle));

  char* txid = nullptr;
  char* wtxid = nullptr;
  uint32_t size = 0;
  uint32_t vsize = 0;
  uint32_t weight = 0;
  uint32_t version = 0;
  uint32_t locktime = 0;
  ret = CfdGetTxInfo(
      handle, kCfdNetworkMainnet, exp_tx, &txid, &wtxid, &size, &vsize,
      &weight, &version, &locktime);
  EXPECT_EQ(kCfdSuccess, ret);
  EXPECT_EQ(800, size);
  EXPECT_EQ(316, vsize);
  EXPECT_EQ(1262, weight);
  EXPECT_EQ(1, version);
  EXPECT_EQ(0, locktime);
  if (ret == kCfdSuccess) {
    EXPECT_STREQ("27eae69aff1dd4388c0fa05cbbfe9a3983d1b0b5811ebcd4199b86f299370aac", txid);
    EXPECT_STREQ("65dab5dd46a501fc695822c73d779067f2feb7c49dc47d39f86fdb2e3960b3bd", wtxid);
    CfdFreeStringBuffer(txid);
    CfdFreeStringBuffer(wtxid);
  }

  char* txin_txid = nullptr;
  char* script_sig = nullptr;
  uint32_t vout = 0;
  uint32_t sequence = 0;
  ret = CfdGetTxIn(
      handle, kCfdNetworkMainnet, exp_tx, 0,
      &txin_txid, &vout, &sequence, &script_sig);
  EXPECT_EQ(kCfdSuccess, ret);
  if (ret == kCfdSuccess) {
    EXPECT_STREQ("6eb98797a21c6c10aa74edf29d618be109f48a8e94c694f3701e08ca69186436", txin_txid);
    EXPECT_EQ(1, vout);
    EXPECT_EQ(4294967295, sequence);
    EXPECT_STREQ("220020a16b5755f7f6f96dbd65f5f0d6ab9418b89af4b1f14a1bb8a09062c35f0dcb54", script_sig);
    CfdFreeStringBuffer(txin_txid);
    CfdFreeStringBuffer(script_sig);
  }

  char* stack_data = nullptr;
  ret = CfdGetTxInWitness(
      handle, kCfdNetworkMainnet, exp_tx, 0, 7, &stack_data);
  EXPECT_EQ(kCfdSuccess, ret);
  if (ret == kCfdSuccess) {
    EXPECT_STREQ("56210307b8ae49ac90a048e9b53357a2354b3334e9c8bee813ecb98e99a7e07e8c3ba32103b28f0c28bfab54554ae8c658ac5c3e0ce6e79ad336331f78c428dd43eea8449b21034b8113d703413d57761b8b9781957b8c0ac1dfe69f492580ca4195f50376ba4a21033400f6afecb833092a9a21cfdf1ed1376e58c5d1f47de74683123987e967a8f42103a6d48b1131e94ba04d9737d61acdaa1322008af9602b3b14862c07a1789aac162102d8b661b0b3302ee2f162b09e07a55ad5dfbe673a9f01d9f0c19617681024306b56ae", stack_data);
    CfdFreeStringBuffer(stack_data);
  }

  int64_t value_satoshi = 0;
  char* locking_script = nullptr;
  ret = CfdGetTxOut(
      handle, kCfdNetworkMainnet, exp_tx, 1,
      &value_satoshi, &locking_script);
  EXPECT_EQ(kCfdSuccess, ret);
  if (ret == kCfdSuccess) {
    EXPECT_EQ(87000000, value_satoshi);
    EXPECT_STREQ("76a9147480a33f950689af511e6e84c138dbbd3c3ee41588ac", locking_script);
    CfdFreeStringBuffer(locking_script);
  }

  uint32_t count = 0;
  ret = CfdGetTxInCount(
      handle, kCfdNetworkMainnet, exp_tx, &count);
  EXPECT_EQ(kCfdSuccess, ret);
  EXPECT_EQ(1, count);

  ret = CfdGetTxInWitnessCount(
      handle, kCfdNetworkMainnet, exp_tx, 0, &count);
  EXPECT_EQ(kCfdSuccess, ret);
  EXPECT_EQ(8, count);

  ret = CfdGetTxOutCount(
      handle, kCfdNetworkMainnet, exp_tx, &count);
  EXPECT_EQ(kCfdSuccess, ret);
  EXPECT_EQ(2, count);

  uint32_t index = 0;
  ret = CfdGetTxInIndex(
      handle, kCfdNetworkMainnet, exp_tx,
      "6eb98797a21c6c10aa74edf29d618be109f48a8e94c694f3701e08ca69186436", 1, &index);
  EXPECT_EQ(kCfdSuccess, ret);
  EXPECT_EQ(0, index);

  ret = CfdGetTxOutIndex(
      handle, kCfdNetworkMainnet, exp_tx, "16AQVuBMt818u2HBcbxztAZTT2VTDKupPS", "", &index);
  EXPECT_EQ(kCfdSuccess, ret);
  EXPECT_EQ(0, index);

  ret = CfdGetTxOutIndex(
      handle, kCfdNetworkMainnet, exp_tx, "", "76a9147480a33f950689af511e6e84c138dbbd3c3ee41588ac", &index);
  EXPECT_EQ(kCfdSuccess, ret);
  EXPECT_EQ(1, index);

  ret = CfdGetLastErrorCode(handle);
  if (ret != kCfdSuccess) {
    char* str_buffer = NULL;
    ret = CfdGetLastErrorMessage(handle, &str_buffer);
    EXPECT_EQ(kCfdSuccess, ret);
    EXPECT_STREQ("", str_buffer);
    CfdFreeStringBuffer(str_buffer);
    str_buffer = NULL;
  }

  ret = CfdFreeHandle(handle);
  EXPECT_EQ(kCfdSuccess, ret);
}